

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O2

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  bool bVar1;
  uchar *puVar2;
  void **ppvVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  uchar *puVar9;
  long lVar10;
  uchar *puVar11;
  byte *pbVar12;
  int itemsize;
  int itemsize_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined4 in_register_00000014;
  size_t extraout_RDX;
  size_t sVar13;
  int best_filter_val;
  int iVar14;
  undefined8 *puVar15;
  ulong uVar16;
  byte bVar17;
  undefined4 in_register_00000084;
  ulong uVar18;
  byte *pbVar19;
  uint uVar20;
  byte *pbVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  uint local_a8;
  uint local_a4;
  uchar *local_a0;
  byte *local_98;
  void *local_90;
  size_t local_88;
  ulong local_80;
  uchar *local_78;
  void *local_70;
  uchar *local_68;
  uint local_5c;
  undefined8 local_58;
  int local_4c;
  int *local_48;
  size_t local_40;
  void **local_38;
  
  local_58 = CONCAT44(in_register_00000014,x);
  uVar20 = x * 4;
  local_a4 = stride_bytes;
  if (stride_bytes == 0) {
    local_a4 = uVar20;
  }
  iVar14 = x * 4 + 1;
  local_80 = (ulong)(uint)(iVar14 * y);
  local_40 = (size_t)(iVar14 * y);
  local_78 = pixels;
  local_5c = y;
  local_90 = malloc(local_40);
  if (local_90 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_88 = (size_t)(int)uVar20;
  local_48 = (int *)CONCAT44(in_register_00000084,n);
  pvVar8 = malloc(local_88);
  if (pvVar8 == (void *)0x0) {
    free(local_90);
    return (uchar *)0x0;
  }
  pbVar19 = (byte *)0x0;
  pbVar21 = (byte *)(ulong)uVar20;
  if ((int)uVar20 < 1) {
    pbVar21 = pbVar19;
  }
  local_68 = (uchar *)(long)iVar14;
  local_98 = (byte *)0x0;
  if (0 < (int)local_5c) {
    local_98 = (byte *)(ulong)local_5c;
  }
  for (; pbVar19 != local_98; pbVar19 = pbVar19 + 1) {
    iVar14 = 0x7fffffff;
    iVar23 = 0;
    iVar24 = 0;
    while( true ) {
      if (iVar23 == 5) break;
      stbiw__encode_png_line
                (local_78,local_a4,(int)local_58,(int)pbVar19,iVar23,(int)pvVar8,
                 in_stack_ffffffffffffff48,
                 (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      iVar5 = 0;
      for (pbVar12 = (byte *)0x0; pbVar21 != pbVar12; pbVar12 = pbVar12 + 1) {
        bVar17 = (char)*(byte *)((long)pvVar8 + (long)pbVar12) >> 7;
        iVar5 = iVar5 + (uint)(byte)((*(byte *)((long)pvVar8 + (long)pbVar12) ^ bVar17) - bVar17);
      }
      if (iVar5 < iVar14) {
        iVar14 = iVar5;
        iVar24 = iVar23;
      }
      iVar23 = iVar23 + 1;
    }
    uVar4 = 5;
    if (iVar24 != 5) {
      stbiw__encode_png_line
                (local_78,local_a4,(int)local_58,(int)pbVar19,iVar24,(int)pvVar8,
                 in_stack_ffffffffffffff48,
                 (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      uVar4 = (undefined1)iVar24;
    }
    *(undefined1 *)((long)local_90 + (long)pbVar19 * (long)local_68) = uVar4;
    memcpy((void *)((long)local_90 + (long)pbVar19 * (long)local_68 + 1),pvVar8,local_88);
  }
  free(pvVar8);
  local_a0 = (uchar *)0x0;
  pvVar8 = malloc(0x20000);
  if (pvVar8 == (void *)0x0) {
    puVar9 = (uchar *)0x0;
    goto LAB_00114bba;
  }
  stbiw__sbgrowf(&local_a0,1,itemsize);
  iVar14 = *(int *)(local_a0 + -4);
  *(int *)(local_a0 + -4) = iVar14 + 1;
  local_a0[iVar14] = 'x';
  iVar24 = *(int *)(local_a0 + -4);
  iVar14 = iVar24 + 1;
  if (*(int *)(local_a0 + -8) <= iVar14) {
    stbiw__sbgrowf(&local_a0,1,itemsize_00);
    iVar24 = *(int *)(local_a0 + -4);
    iVar14 = iVar24 + 1;
  }
  *(int *)(local_a0 + -4) = iVar14;
  local_a0[iVar24] = '^';
  uVar20 = 1;
  local_a8 = uVar20;
  puVar9 = stbiw__zlib_flushf(local_a0,&local_a8,(int *)&stack0xffffffffffffff54);
  local_a8 = local_a8 | 1 << ((byte)uVar20 & 0x1f);
  iVar14 = uVar20 + 2;
  puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    *(undefined8 *)((long)pvVar8 + lVar10 * 8) = 0;
  }
  local_4c = (int)local_80 + -3;
  sVar13 = 0;
  local_a0 = puVar9;
  local_70 = pvVar8;
  while (iVar24 = (int)sVar13, iVar24 < local_4c) {
    local_98 = (byte *)((long)iVar24 + (long)local_90);
    uVar20 = stbiw__zhash(local_98);
    puVar15 = *(undefined8 **)((long)pvVar8 + (ulong)(uVar20 & 0x3fff) * 8);
    if (puVar15 == (undefined8 *)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)*(int *)((long)puVar15 + -4);
    }
    local_38 = (void **)((long)pvVar8 + (ulong)(uVar20 & 0x3fff) * 8);
    iVar23 = (int)local_80;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    local_a4 = 3;
    local_78 = (uchar *)0x0;
    local_88 = sVar13;
    local_68 = puVar9;
    for (lVar22 = 0; ppvVar3 = local_38, pbVar21 = local_98, lVar10 != lVar22; lVar22 = lVar22 + 1)
    {
      puVar9 = (uchar *)puVar15[lVar22];
      if ((long)(iVar24 + -0x8000) < (long)puVar9 - (long)local_90) {
        uVar6 = stbiw__zlib_countm(puVar9,local_98,iVar23 - iVar24);
        uVar20 = local_a4;
        if ((int)local_a4 < (int)uVar6) {
          uVar20 = uVar6;
        }
        bVar1 = (int)local_a4 <= (int)uVar6;
        sVar13 = extraout_RDX;
        local_a4 = uVar20;
        if (bVar1) {
          local_78 = puVar9;
        }
      }
    }
    if (puVar15 == (undefined8 *)0x0) {
LAB_00114554:
      stbiw__sbgrowf(local_38,8,(int)sVar13);
      puVar15 = (undefined8 *)*ppvVar3;
      iVar24 = *(int *)((long)puVar15 + -4);
      iVar23 = iVar24 + 1;
    }
    else {
      iVar24 = *(int *)((long)puVar15 + -4);
      if (iVar24 == 0x10) {
        puVar15[6] = puVar15[0xe];
        puVar15[7] = puVar15[0xf];
        puVar15[4] = puVar15[0xc];
        puVar15[5] = puVar15[0xd];
        puVar15[2] = puVar15[10];
        puVar15[3] = puVar15[0xb];
        *puVar15 = puVar15[8];
        puVar15[1] = puVar15[9];
        *(undefined4 *)((long)puVar15 + -4) = 8;
        iVar24 = 8;
      }
      iVar23 = iVar24 + 1;
      if (*(int *)(puVar15 + -1) <= iVar23) goto LAB_00114554;
    }
    *(int *)((long)puVar15 + -4) = iVar23;
    puVar15[iVar24] = pbVar21;
    if (local_78 == (uchar *)0x0) {
LAB_00114605:
      bVar17 = *local_98;
      if (bVar17 < 0x90) {
        iVar24 = stbiw__zlib_bitrev(bVar17 + 0x30,8);
        local_a8 = local_a8 | iVar24 << ((byte)iVar14 & 0x1f);
        iVar14 = iVar14 + 8;
      }
      else {
        iVar24 = stbiw__zlib_bitrev(bVar17 | 0x100,9);
        local_a8 = local_a8 | iVar24 << ((byte)iVar14 & 0x1f);
        iVar14 = iVar14 + 9;
      }
      iVar24 = (int)local_88;
      puVar9 = local_68;
      pvVar8 = local_70;
      uVar20 = 1;
LAB_001147f8:
      puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
    }
    else {
      pbVar21 = local_98 + 1;
      uVar20 = stbiw__zhash(pbVar21);
      lVar10 = *(long *)((long)local_70 + (ulong)(uVar20 & 0x3fff) * 8);
      if (lVar10 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = *(uint *)(lVar10 + -4);
      }
      uVar6 = (uint)local_88;
      iVar24 = ~uVar6 + (int)local_80;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      for (uVar16 = 0; puVar9 = local_68, pvVar8 = local_70, uVar20 != uVar16; uVar16 = uVar16 + 1)
      {
        puVar9 = *(uchar **)(lVar10 + uVar16 * 8);
        if (((long)(int)(uVar6 - 0x7fff) < (long)puVar9 - (long)local_90) &&
           (uVar7 = stbiw__zlib_countm(puVar9,pbVar21,iVar24), (int)local_a4 < (int)uVar7))
        goto LAB_00114605;
      }
      uVar20 = (int)local_98 - (int)local_78;
      local_98 = (byte *)(ulong)uVar20;
      if ((0x7fff < (int)uVar20) || (0x102 < (int)local_a4)) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image-write.h"
                      ,0x3bf,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      uVar16 = 0;
      do {
        uVar18 = uVar16;
        uVar16 = uVar18 + 1;
      } while ((int)(uint)*(ushort *)(stbi_zlib_compress_lengthc + uVar18 * 2 + 2) <= (int)local_a4)
      ;
      iVar24 = (int)(uVar18 + 1);
      if (uVar18 < 0x17) {
        iVar24 = stbiw__zlib_bitrev(iVar24,7);
        local_a8 = iVar24 << ((byte)iVar14 & 0x1f) | local_a8;
        iVar14 = iVar14 + 7;
      }
      else {
        iVar24 = stbiw__zlib_bitrev(iVar24 + 0xa8,8);
        local_a8 = iVar24 << ((byte)iVar14 & 0x1f) | local_a8;
        iVar14 = iVar14 + 8;
      }
      puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
      uVar18 = uVar18 & 0xffffffff;
      if (0xffffffffffffffeb < uVar18 - 0x1c) {
        local_a8 = local_a8 |
                   local_a4 - *(ushort *)(stbi_zlib_compress_lengthc + uVar18 * 2) <<
                   ((byte)iVar14 & 0x1f);
        iVar14 = (uint)(byte)stbi_zlib_compress_lengtheb[uVar18] + iVar14;
        puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
      }
      uVar16 = 0xffffffffffffffff;
      do {
        lVar10 = uVar16 * 2;
        uVar16 = uVar16 + 1;
      } while ((int)(uint)*(ushort *)(stbi_zlib_compress_distc + lVar10 + 4) <= (int)local_98);
      iVar24 = stbiw__zlib_bitrev((int)uVar16,5);
      local_a8 = local_a8 | iVar24 << ((byte)iVar14 & 0x1f);
      iVar14 = iVar14 + 5;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
      iVar24 = (int)local_88;
      uVar20 = local_a4;
      if (3 < uVar16) {
        local_a8 = local_a8 |
                   (int)local_98 -
                   (uint)*(ushort *)(stbi_zlib_compress_distc + (uVar16 & 0xffffffff) * 2) <<
                   ((byte)iVar14 & 0x1f);
        iVar14 = (uint)(byte)stbi_zlib_compress_disteb[uVar16 & 0xffffffff] + iVar14;
        goto LAB_001147f8;
      }
    }
    sVar13 = (size_t)(uVar20 + iVar24);
  }
  local_a0 = puVar9;
  for (lVar10 = (long)iVar24; lVar10 < (long)local_40; lVar10 = lVar10 + 1) {
    bVar17 = *(byte *)((long)local_90 + lVar10);
    if (bVar17 < 0x90) {
      iVar24 = stbiw__zlib_bitrev(bVar17 + 0x30,8);
      local_a8 = iVar24 << ((byte)iVar14 & 0x1f) | local_a8;
      iVar14 = iVar14 + 8;
    }
    else {
      iVar24 = stbiw__zlib_bitrev(bVar17 | 0x100,9);
      local_a8 = iVar24 << ((byte)iVar14 & 0x1f) | local_a8;
      iVar14 = iVar14 + 9;
    }
    puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
  }
  local_a0 = puVar9;
  iVar24 = stbiw__zlib_bitrev(0,7);
  local_a8 = local_a8 | iVar24 << ((byte)iVar14 & 0x1f);
  iVar14 = iVar14 + 7;
  do {
    iVar24 = iVar14;
    puVar9 = stbiw__zlib_flushf(puVar9,&local_a8,(int *)&stack0xffffffffffffff54);
    pvVar8 = local_70;
    iVar14 = iVar24 + 1;
  } while (iVar24 != 0);
  local_a0 = puVar9;
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    lVar22 = *(long *)((long)pvVar8 + lVar10 * 8);
    if (lVar22 != 0) {
      free((void *)(lVar22 + -8));
    }
  }
  free(pvVar8);
  if ((((int)local_80 + 0x7ffe) / 0x7fff) * 5 + (int)local_80 + 2 < *(int *)(puVar9 + -4)) {
    puVar9[-4] = '\x02';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    iVar14 = 2;
    for (iVar24 = 0; uVar20 = (int)local_80 - iVar24, uVar20 != 0 && iVar24 <= (int)local_80;
        iVar24 = iVar24 + uVar6) {
      uVar6 = 0x7fff;
      if ((int)uVar20 < 0x7fff) {
        uVar6 = uVar20;
      }
      iVar23 = iVar14 + 1;
      if (*(int *)(puVar9 + -8) <= iVar23) {
        stbiw__sbgrowf(&local_a0,1,(int)puVar9);
        iVar14 = *(int *)(local_a0 + -4);
        iVar23 = iVar14 + 1;
        puVar9 = local_a0;
      }
      *(int *)(puVar9 + -4) = iVar23;
      puVar9[iVar14] = (int)uVar20 < 0x8000;
      if (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1) {
        stbiw__sbgrowf(&local_a0,1,(int)puVar9);
      }
      iVar14 = *(int *)(local_a0 + -4);
      *(int *)(local_a0 + -4) = iVar14 + 1;
      local_a0[iVar14] = (uchar)uVar6;
      iVar23 = *(int *)(local_a0 + -4);
      iVar14 = iVar23 + 1;
      if (*(int *)(local_a0 + -8) <= iVar14) {
        stbiw__sbgrowf(&local_a0,1,iVar14);
        iVar23 = *(int *)(local_a0 + -4);
        iVar14 = iVar23 + 1;
      }
      *(int *)(local_a0 + -4) = iVar14;
      local_a0[iVar23] = (uchar)(uVar6 >> 8);
      iVar23 = *(int *)(local_a0 + -4);
      iVar14 = iVar23 + 1;
      if (*(int *)(local_a0 + -8) <= iVar14) {
        stbiw__sbgrowf(&local_a0,1,iVar14);
        iVar23 = *(int *)(local_a0 + -4);
        iVar14 = iVar23 + 1;
      }
      *(int *)(local_a0 + -4) = iVar14;
      local_a0[iVar23] = (uchar)~uVar6;
      if (*(int *)(local_a0 + -8) <= *(int *)(local_a0 + -4) + 1) {
        stbiw__sbgrowf(&local_a0,1,iVar14);
      }
      puVar9 = local_a0;
      iVar14 = *(int *)(local_a0 + -4);
      *(int *)(local_a0 + -4) = iVar14 + 1;
      local_a0[iVar14] = (uchar)(~uVar6 >> 8);
      memcpy(local_a0 + *(int *)(local_a0 + -4),(void *)((long)iVar24 + (long)local_90),
             (long)(int)uVar6);
      iVar14 = *(int *)(puVar9 + -4) + uVar6;
      *(int *)(puVar9 + -4) = iVar14;
    }
  }
  uVar18 = (long)((ulong)(uint)((int)local_80 >> 0x1f) << 0x20 | local_80 & 0xffffffff) % 0x15b0 &
           0xffffffff;
  uVar20 = 1;
  uVar6 = 0;
  uVar16 = uVar18;
  for (iVar14 = 0; iVar24 = (int)uVar16, iVar14 < (int)local_80; iVar14 = iVar14 + iVar24) {
    iVar24 = (int)uVar18;
    uVar16 = 0;
    if (0 < iVar24) {
      uVar16 = uVar18;
    }
    for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      uVar20 = uVar20 + *(byte *)((long)local_90 + uVar18 + (long)iVar14);
      uVar6 = uVar6 + uVar20;
    }
    uVar20 = uVar20 % 0xfff1;
    uVar16 = (ulong)uVar6 % 0xfff1;
    uVar18 = 0x15b0;
    uVar6 = (uint)uVar16;
  }
  if (puVar9 == (uchar *)0x0) {
LAB_00114b01:
    stbiw__sbgrowf(&local_a0,1,iVar24);
    iVar23 = *(int *)(local_a0 + -4);
    iVar14 = iVar23 + 1;
    puVar9 = local_a0;
    iVar24 = extraout_EDX;
  }
  else {
    iVar23 = *(int *)(puVar9 + -4);
    iVar14 = iVar23 + 1;
    if (*(int *)(puVar9 + -8) <= iVar14) goto LAB_00114b01;
  }
  *(int *)(puVar9 + -4) = iVar14;
  puVar9[iVar23] = (uchar)(uVar6 >> 8);
  if (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1) {
    stbiw__sbgrowf(&local_a0,1,iVar24);
    iVar24 = extraout_EDX_00;
  }
  iVar14 = *(int *)(local_a0 + -4);
  *(int *)(local_a0 + -4) = iVar14 + 1;
  local_a0[iVar14] = (uchar)uVar6;
  iVar23 = *(int *)(local_a0 + -4);
  iVar14 = iVar23 + 1;
  if (*(int *)(local_a0 + -8) <= iVar14) {
    stbiw__sbgrowf(&local_a0,1,iVar24);
    iVar23 = *(int *)(local_a0 + -4);
    iVar14 = iVar23 + 1;
    iVar24 = extraout_EDX_01;
  }
  *(int *)(local_a0 + -4) = iVar14;
  local_a0[iVar23] = (uchar)(uVar20 >> 8);
  iVar23 = *(int *)(local_a0 + -4);
  iVar14 = iVar23 + 1;
  if (*(int *)(local_a0 + -8) <= iVar14) {
    stbiw__sbgrowf(&local_a0,1,iVar24);
    iVar23 = *(int *)(local_a0 + -4);
    iVar14 = iVar23 + 1;
  }
  *(int *)(local_a0 + -4) = iVar14;
  local_a0[iVar23] = (uchar)uVar20;
  iVar14 = *(int *)(local_a0 + -4);
  puVar9 = local_a0 + -8;
  memmove(puVar9,local_a0,(long)iVar14);
LAB_00114bba:
  free(local_90);
  if (puVar9 != (uchar *)0x0) {
    puVar11 = (uchar *)malloc((long)(iVar14 + 0x39));
    if (puVar11 != (uchar *)0x0) {
      *local_48 = iVar14 + 0x39;
      puVar11[0] = 0x89;
      puVar11[1] = 'P';
      puVar11[2] = 'N';
      puVar11[3] = 'G';
      puVar11[4] = '\r';
      puVar11[5] = '\n';
      puVar11[6] = '\x1a';
      puVar11[7] = '\n';
      puVar11[8] = '\0';
      puVar11[9] = '\0';
      puVar11[10] = '\0';
      puVar11[0xb] = '\r';
      puVar11[0xc] = 'I';
      puVar11[0xd] = 'H';
      puVar11[0xe] = 'D';
      puVar11[0xf] = 'R';
      puVar11[0x10] = (uchar)((ulong)local_58 >> 0x18);
      puVar11[0x11] = (uchar)((ulong)local_58 >> 0x10);
      puVar11[0x12] = (uchar)((ulong)local_58 >> 8);
      puVar11[0x13] = (uchar)local_58;
      puVar11[0x14] = (uchar)(local_5c >> 0x18);
      puVar11[0x15] = (uchar)(local_5c >> 0x10);
      puVar11[0x16] = (uchar)(local_5c >> 8);
      puVar11[0x17] = (uchar)local_5c;
      puVar11[0x18] = '\b';
      puVar11[0x19] = '\x06';
      puVar11[0x1a] = '\0';
      puVar11[0x1b] = '\0';
      local_a0 = puVar11 + 0x1d;
      puVar11[0x1c] = '\0';
      stbiw__wpcrc(&local_a0,0xd);
      puVar2 = local_a0;
      *local_a0 = (uchar)((uint)iVar14 >> 0x18);
      local_a0[1] = (uchar)((uint)iVar14 >> 0x10);
      local_a0[2] = (uchar)((uint)iVar14 >> 8);
      local_a0[3] = (uchar)iVar14;
      local_a0[4] = 'I';
      local_a0[5] = 'D';
      local_a0[6] = 'A';
      local_a0[7] = 'T';
      memmove(local_a0 + 8,puVar9,(long)iVar14);
      local_a0 = puVar2 + (long)iVar14 + 8;
      free(puVar9);
      stbiw__wpcrc(&local_a0,iVar14);
      local_a0[0] = '\0';
      local_a0[1] = '\0';
      local_a0[2] = '\0';
      local_a0[3] = '\0';
      local_a0[4] = 'I';
      local_a0[5] = 'E';
      local_a0[6] = 'N';
      local_a0[7] = 'D';
      local_a0 = local_a0 + 8;
      stbiw__wpcrc(&local_a0,0);
      if (local_a0 != puVar11 + *local_48) {
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image-write.h"
                      ,0x4b9,
                      "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                     );
      }
      return puVar11;
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}